

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.hpp
# Opt level: O1

SPIRExtension * __thiscall
diligent_spirv_cross::Parser::
set<diligent_spirv_cross::SPIRExtension,diligent_spirv_cross::SPIRExtension::Extension&>
          (Parser *this,uint32_t id,Extension *args)

{
  Variant *this_00;
  IVariant *val;
  
  ParsedIR::add_typed_id(&this->ir,TypeExtension,(ID)id);
  this_00 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr + id;
  val = &ObjectPool<diligent_spirv_cross::SPIRExtension>::
         allocate<diligent_spirv_cross::SPIRExtension::Extension&>
                   ((ObjectPool<diligent_spirv_cross::SPIRExtension> *)
                    this_00->group->pools[7]._M_t.
                    super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                    .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>.
                    _M_head_impl,args)->super_IVariant;
  Variant::set(this_00,val,TypeExtension);
  (val->self).id = id;
  return (SPIRExtension *)val;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		return var;
	}